

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFuzzyImageCompare.cpp
# Opt level: O3

float tcu::fuzzyCompare(FuzzyCompareParams *params,ConstPixelBufferAccess *ref,
                       ConstPixelBufferAccess *cmp,PixelBufferAccess *errorMask)

{
  ChannelOrder CVar1;
  int iVar2;
  double dVar3;
  int iVar4;
  undefined8 uVar5;
  int iVar6;
  deUint32 dVar7;
  uint uVar8;
  pointer pfVar9;
  InternalError *this;
  int y;
  int x;
  int iVar10;
  ulong uVar11;
  uint width;
  bool bVar12;
  float fVar13;
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  ConstPixelBufferAccess refAccess;
  ConstPixelBufferAccess cmpAccess;
  Random rnd;
  TextureLevel cmpFiltered;
  TextureLevel refFiltered;
  ulong local_1a0;
  ulong local_188;
  ConstPixelBufferAccess local_178;
  PixelBufferAccess *local_148;
  ulong local_140;
  ConstPixelBufferAccess local_138;
  vector<float,_std::allocator<float>_> local_110;
  ConstPixelBufferAccess local_f8;
  ulong local_d0;
  ulong local_c8;
  void *local_c0;
  void *local_b8;
  ulong local_b0;
  FuzzyCompareParams *local_a8;
  long local_a0;
  long local_98;
  deRandom local_90;
  TextureLevel local_80;
  TextureLevel local_58;
  
  local_148 = errorMask;
  local_a8 = params;
  if (((((ref->m_format).type == UNORM_INT8) && ((ref->m_format).order - RGB < 2)) &&
      ((cmp->m_format).type == UNORM_INT8)) && ((cmp->m_format).order - RGB < 2)) {
    width = (ref->m_size).m_data[0];
    uVar8 = (ref->m_size).m_data[1];
    deRandom_init(&local_90,0x29b);
    local_80.m_format.order = RGBA;
    local_80.m_format.type = UNORM_INT8;
    TextureLevel::TextureLevel(&local_58,&local_80.m_format,width,uVar8,1);
    local_178.m_format.order = RGBA;
    local_178.m_format.type = UNORM_INT8;
    TextureLevel::TextureLevel(&local_80,&local_178.m_format,width,uVar8,1);
    pfVar9 = (pointer)operator_new(0xc);
    local_110.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = pfVar9 + 3;
    pfVar9[2] = 0.1;
    pfVar9[0] = 0.1;
    pfVar9[1] = 0.8;
    CVar1 = (ref->m_format).order;
    local_110.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = pfVar9;
    local_110.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         local_110.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
         ._M_finish;
    if (CVar1 == RGB) {
      PixelBufferAccess::PixelBufferAccess((PixelBufferAccess *)&local_178,&local_58);
      separableConvolve<4,3>((PixelBufferAccess *)&local_178,ref,1,1,&local_110,&local_110);
    }
    else if (CVar1 == RGBA) {
      PixelBufferAccess::PixelBufferAccess((PixelBufferAccess *)&local_178,&local_58);
      separableConvolve<4,4>((PixelBufferAccess *)&local_178,ref,1,1,&local_110,&local_110);
    }
    CVar1 = (cmp->m_format).order;
    if (CVar1 == RGB) {
      PixelBufferAccess::PixelBufferAccess((PixelBufferAccess *)&local_178,&local_80);
      separableConvolve<4,3>((PixelBufferAccess *)&local_178,cmp,1,1,&local_110,&local_110);
    }
    else if (CVar1 == RGBA) {
      PixelBufferAccess::PixelBufferAccess((PixelBufferAccess *)&local_178,&local_80);
      separableConvolve<4,4>((PixelBufferAccess *)&local_178,cmp,1,1,&local_110,&local_110);
    }
    local_178.m_format.order = R;
    local_178.m_format.type = 0x3f800000;
    local_178.m_size.m_data[0] = 0;
    local_178.m_size.m_data[1] = 0x3f800000;
    clear(local_148,(Vec4 *)&local_178);
    TextureLevel::getAccess((PixelBufferAccess *)&local_138,&local_58);
    local_178.m_format = local_138.m_format;
    local_178.m_size.m_data[0] = local_138.m_size.m_data[0];
    local_178.m_size.m_data[1] = local_138.m_size.m_data[1];
    local_178.m_size.m_data[2] = local_138.m_size.m_data[2];
    local_178.m_pitch.m_data[0] = local_138.m_pitch.m_data[0];
    local_178.m_pitch.m_data[1] = local_138.m_pitch.m_data[1];
    local_178.m_pitch.m_data[2] = local_138.m_pitch.m_data[2];
    local_b8 = local_138.m_data;
    local_178.m_data = local_138.m_data;
    TextureLevel::getAccess((PixelBufferAccess *)&local_f8,&local_80);
    local_138.m_size.m_data[2] = local_f8.m_size.m_data[2];
    local_138.m_pitch.m_data[0] = local_f8.m_pitch.m_data[0];
    local_138.m_pitch.m_data[1] = local_f8.m_pitch.m_data[1];
    uVar5 = local_138.m_pitch.m_data._0_8_;
    local_138.m_pitch.m_data[2] = local_f8.m_pitch.m_data[2];
    local_c0 = local_f8.m_data;
    local_138.m_data = local_f8.m_data;
    dVar14 = 0.0;
    dVar3 = 0.0;
    if (1 < (int)(uVar8 - 1)) {
      iVar4 = local_178.m_pitch.m_data[1];
      local_138.m_pitch.m_data[1] = local_f8.m_pitch.m_data[1];
      iVar6 = local_138.m_pitch.m_data[1];
      local_b0 = (ulong)(uVar8 - 1);
      uVar11 = 0;
      local_188 = 1;
      local_1a0 = 0;
      local_138.m_pitch.m_data._0_8_ = uVar5;
      local_d0 = (ulong)width;
      local_c8 = (ulong)uVar8;
      do {
        if (1 < (int)(width - 1)) {
          y = (int)local_188;
          local_98 = (long)(iVar4 * y) + (long)local_b8;
          local_a0 = (long)(iVar6 * y) + (long)local_c0;
          x = 1;
          do {
            local_140 = uVar11;
            dVar7 = distSquaredToNeighbor<4>
                              ((Random *)&local_90,*(deUint32 *)(local_98 + x * 4),&local_138,x,y);
            uVar8 = distSquaredToNeighbor<4>
                              ((Random *)&local_90,*(deUint32 *)(local_a0 + x * 4),&local_178,x,y);
            if (dVar7 < uVar8) {
              uVar8 = dVar7;
            }
            bVar12 = CARRY8(local_1a0,(ulong)(uVar8 * uVar8));
            local_1a0 = local_1a0 + uVar8 * uVar8;
            if (bVar12) {
              local_1a0 = 0xffffffffffffffff;
            }
            ConstPixelBufferAccess::getPixel(&local_f8,(int)cmp,x,y);
            local_f8.m_format.type =
                 (ChannelType)
                 (((float)local_f8.m_size.m_data[0] * 0.0722 +
                  (float)local_f8.m_format.order * 0.2126 + (float)local_f8.m_format.type * 0.7152)
                  * 0.3 + 0.7);
            fVar13 = ((float)uVar8 / 63001.0) * ((float)uVar8 / 63001.0) * 500.0;
            local_f8.m_format.order = (ChannelOrder)((float)local_f8.m_format.type * fVar13);
            local_f8.m_format.type = (ChannelType)((float)local_f8.m_format.type * (1.0 - fVar13));
            local_f8.m_size.m_data[0] = 0;
            local_f8.m_size.m_data[1] = 0x3f800000;
            PixelBufferAccess::setPixel(local_148,(Vec4 *)&local_f8,x,y,0);
            iVar2 = local_a8->maxSampleSkip;
            if (iVar2 < 1) {
              uVar8 = 1;
              iVar10 = (int)local_140;
            }
            else {
              dVar7 = deRandom_getUint32(&local_90);
              iVar10 = (int)local_140;
              uVar8 = dVar7 % (iVar2 + 1U);
            }
            x = uVar8 + x;
            uVar11 = (ulong)(iVar10 + 1);
          } while (x < (int)(width - 1));
        }
        local_188 = local_188 + 1;
      } while (local_188 != local_b0);
      dVar3 = (double)(int)uVar11;
      dVar14 = ((double)CONCAT44(0x45300000,(int)(local_1a0 >> 0x20)) - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)local_1a0) - 4503599627370496.0);
      uVar8 = (uint)local_c8;
      width = (uint)local_d0;
    }
    auVar15._8_8_ = (double)(int)((uVar8 - 2) * (width - 2));
    auVar15._0_8_ = dVar14;
    auVar16._8_4_ = SUB84(dVar3,0);
    auVar16._0_8_ = 0x41ed9281ce200000;
    auVar16._12_4_ = (int)((ulong)dVar3 >> 0x20);
    auVar16 = divpd(auVar15,auVar16);
    operator_delete(pfVar9,0xc);
    TextureLevel::~TextureLevel(&local_80);
    TextureLevel::~TextureLevel(&local_58);
    return (float)(auVar16._8_8_ * auVar16._0_8_);
  }
  this = (InternalError *)__cxa_allocate_exception(0x38);
  InternalError::InternalError
            (this,"Unsupported format in fuzzy comparison",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/common/tcuFuzzyImageCompare.cpp"
             ,0x117);
  __cxa_throw(this,&InternalError::typeinfo,Exception::~Exception);
}

Assistant:

float fuzzyCompare (const FuzzyCompareParams& params, const ConstPixelBufferAccess& ref, const ConstPixelBufferAccess& cmp, const PixelBufferAccess& errorMask)
{
	DE_ASSERT(ref.getWidth() == cmp.getWidth() && ref.getHeight() == cmp.getHeight());
	DE_ASSERT(errorMask.getWidth() == ref.getWidth() && errorMask.getHeight() == ref.getHeight());

	if (!isFormatSupported(ref.getFormat()) || !isFormatSupported(cmp.getFormat()))
		throw InternalError("Unsupported format in fuzzy comparison", DE_NULL, __FILE__, __LINE__);

	int			width	= ref.getWidth();
	int			height	= ref.getHeight();
	de::Random	rnd		(667);

	// Filtered
	TextureLevel refFiltered(TextureFormat(TextureFormat::RGBA, TextureFormat::UNORM_INT8), width, height);
	TextureLevel cmpFiltered(TextureFormat(TextureFormat::RGBA, TextureFormat::UNORM_INT8), width, height);

	// Kernel = {0.1, 0.8, 0.1}
	vector<float> kernel(3);
	kernel[0] = kernel[2] = 0.1f; kernel[1]= 0.8f;
	int shift = (int)(kernel.size() - 1) / 2;

	switch (ref.getFormat().order)
	{
		case TextureFormat::RGBA:	separableConvolve<4, 4>(refFiltered, ref, shift, shift, kernel, kernel);	break;
		case TextureFormat::RGB:	separableConvolve<4, 3>(refFiltered, ref, shift, shift, kernel, kernel);	break;
		default:
			DE_ASSERT(DE_FALSE);
	}

	switch (cmp.getFormat().order)
	{
		case TextureFormat::RGBA:	separableConvolve<4, 4>(cmpFiltered, cmp, shift, shift, kernel, kernel);	break;
		case TextureFormat::RGB:	separableConvolve<4, 3>(cmpFiltered, cmp, shift, shift, kernel, kernel);	break;
		default:
			DE_ASSERT(DE_FALSE);
	}

	int			numSamples	= 0;
	deUint64	distSum4	= 0ull;

	// Clear error mask to green.
	clear(errorMask, Vec4(0.0f, 1.0f, 0.0f, 1.0f));

	ConstPixelBufferAccess refAccess = refFiltered.getAccess();
	ConstPixelBufferAccess cmpAccess = cmpFiltered.getAccess();

	for (int y = 1; y < height-1; y++)
	{
		for (int x = 1; x < width-1; x += params.maxSampleSkip > 0 ? (int)rnd.getInt(0, params.maxSampleSkip) : 1)
		{
			const deUint32	minDist2RefToCmp	= distSquaredToNeighbor<4>(rnd, readUnorm8<4>(refAccess, x, y), cmpAccess, x, y);
			const deUint32	minDist2CmpToRef	= distSquaredToNeighbor<4>(rnd, readUnorm8<4>(cmpAccess, x, y), refAccess, x, y);
			const deUint32	minDist2			= de::min(minDist2RefToCmp, minDist2CmpToRef);
			const deUint64	newSum4				= distSum4 + minDist2*minDist2;

			distSum4	 = (newSum4 >= distSum4) ? newSum4 : ~0ull; // In case of overflow
			numSamples	+= 1;

			// Build error image.
			{
				const int	scale	= 255-MIN_ERR_THRESHOLD;
				const float	err2	= float(minDist2) / float(scale*scale);
				const float	err4	= err2*err2;
				const float	red		= err4 * 500.0f;
				const float	luma	= toGrayscale(cmp.getPixel(x, y));
				const float	rF		= 0.7f + 0.3f*luma;

				errorMask.setPixel(Vec4(red*rF, (1.0f-red)*rF, 0.0f, 1.0f), x, y);
			}
		}
	}

	{
		// Scale error sum based on number of samples taken
		const double	pSamples	= double((width-2) * (height-2)) / double(numSamples);
		const deUint64	colScale	= deUint64(255-MIN_ERR_THRESHOLD);
		const deUint64	colScale4	= colScale*colScale*colScale*colScale;

		return float(double(distSum4) / double(colScale4) * pSamples);
	}
}